

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HtmlBuilder.h
# Opt level: O1

void __thiscall HTML::TAG::TAG(TAG *this,string *tag,ostream *stream)

{
  pointer pcVar1;
  
  this->_vptr_TAG = (_func_int **)&PTR__TAG_001f8dd8;
  (this->m_tag)._M_dataplus._M_p = (pointer)&(this->m_tag).field_2;
  pcVar1 = (tag->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_tag,pcVar1,pcVar1 + tag->_M_string_length);
  std::__cxx11::stringstream::stringstream((stringstream *)&this->m_value);
  this->m_stream = stream;
  std::__ostream_insert<char,std::char_traits<char>>(stream,"<",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,(this->m_tag)._M_dataplus._M_p,(this->m_tag)._M_string_length);
  return;
}

Assistant:

TAG(const std::string &tag, std::ostream &stream)
      : m_tag(tag),
        m_stream(stream) {
    m_stream << "<" << m_tag;
  }